

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkAbcMux.c
# Opt level: O1

Lpk_Fun_t * Lpk_MuxSplit(Lpk_Man_t *pMan,Lpk_Fun_t *p,int Var,int Pol)

{
  Lpk_Fun_t *pIn;
  Lpk_Fun_t *pOut;
  uint uVar1;
  uint uVar2;
  Lpk_Fun_t *pLVar3;
  byte bVar4;
  uint uVar5;
  ulong uVar6;
  Lpk_Fun_t *pLVar7;
  long lVar8;
  uint uVar9;
  Lpk_Fun_t *pOut_00;
  uint uVar10;
  
  uVar2 = *(uint *)&p->field_0x8 >> 7 & 0x1f;
  bVar4 = (sbyte)uVar2 - 5;
  if (uVar2 < 6) {
    bVar4 = 0;
  }
  if ((Var < 0) || ((int)uVar2 <= Var)) {
    __assert_fail("Var >= 0 && Var < (int)p->nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/lpk/lpkAbcMux.c"
                  ,0xac,"Lpk_Fun_t *Lpk_MuxSplit(Lpk_Man_t *, Lpk_Fun_t *, int, int)");
  }
  if ((*(uint *)&p->field_0x8 & 0x1e0000) == 0) {
    __assert_fail("p->nAreaLim >= 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/lpk/lpkAbcMux.c"
                  ,0xad,"Lpk_Fun_t *Lpk_MuxSplit(Lpk_Man_t *, Lpk_Fun_t *, int, int)");
  }
  if ((-1 << (sbyte)uVar2 ^ p->uSupp) != 0xffffffff) {
    __assert_fail("p->uSupp == Kit_BitMask(p->nVars)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/lpk/lpkAbcMux.c"
                  ,0xae,"Lpk_Fun_t *Lpk_MuxSplit(Lpk_Man_t *, Lpk_Fun_t *, int, int)");
  }
  pIn = p + 1;
  pOut_00 = (Lpk_Fun_t *)(p[1].puSupps + ((ulong)(uint)(1 << (bVar4 & 0x1f)) - 4));
  pOut = (Lpk_Fun_t *)(p[1].puSupps + ((ulong)(uint)(2 << (bVar4 & 0x1f)) - 4));
  Kit_TruthCofactor0New((uint *)pOut_00,(uint *)pIn,uVar2,Var);
  Kit_TruthCofactor1New((uint *)pOut,(uint *)pIn,*(uint *)&p->field_0x8 >> 7 & 0x1f,Var);
  pLVar7 = pOut;
  pLVar3 = pOut_00;
  if (Pol == 0) {
    pLVar7 = pOut_00;
    pLVar3 = pOut;
  }
  pLVar3 = Lpk_FunDup(p,(uint *)pLVar3);
  uVar2 = Kit_TruthSupport((uint *)pLVar7,*(uint *)&p->field_0x8 >> 7 & 0x1f);
  uVar2 = uVar2 | 1 << (Var & 0x1fU);
  p->uSupp = uVar2;
  uVar5 = 0;
  do {
    if ((uVar2 >> (uVar5 & 0x1f) & 1) == 0) goto LAB_0046cd75;
    uVar5 = uVar5 + 1;
  } while (uVar5 != 0x20);
  uVar5 = 0xffffffff;
LAB_0046cd75:
  uVar10 = *(uint *)&p->field_0x8 >> 7 & 0x1f;
  if ((int)uVar10 <= (int)uVar5) {
    __assert_fail("iVarVac < (int)p->nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/lpk/lpkAbcMux.c"
                  ,0xc0,"Lpk_Fun_t *Lpk_MuxSplit(Lpk_Man_t *, Lpk_Fun_t *, int, int)");
  }
  p->uSupp = uVar2 | 1 << (uVar5 & 0x1f);
  uVar2 = 1 << ((char)uVar10 - 5U & 0x1f);
  if (uVar10 < 6) {
    uVar2 = 1;
  }
  lVar8 = (long)(int)uVar5;
  if ((int)uVar5 < 5) {
    uVar5 = *(uint *)(&DAT_0087e460 + lVar8 * 4);
    uVar6 = 0;
    do {
      pIn->puSupps[uVar6 - 4] = uVar5;
      uVar6 = uVar6 + 1;
    } while (uVar2 != uVar6);
  }
  else {
    uVar6 = 0;
    do {
      pIn->puSupps[uVar6 - 4] = -(uint)((1 << ((char)uVar5 - 5U & 0x1f) & (uint)uVar6) != 0);
      uVar6 = uVar6 + 1;
    } while (uVar2 != uVar6);
  }
  pLVar7 = pIn;
  if (Pol != 0) {
    pLVar7 = pOut;
    pOut_00 = pIn;
  }
  Kit_TruthMuxVar((uint *)pIn,(uint *)pOut_00,(uint *)pLVar7,uVar10,Var);
  uVar2 = p->uSupp;
  uVar5 = Kit_TruthSupport((uint *)pIn,*(uint *)&p->field_0x8 >> 7 & 0x1f);
  if (uVar2 == uVar5) {
    p->pFanins[lVar8] = pLVar3->field_0x8 & 0x7f;
    p->pDelays[lVar8] = (char)(*(uint *)&p->field_0x8 >> 0x15) + -1;
    p->field_0xb = p->field_0xb & 0xbf;
    Lpk_FunSuppMinimize(p);
    Lpk_FunSuppMinimize(pLVar3);
    uVar2 = *(uint *)&pLVar3->field_0x8;
    uVar5 = *(int *)&p->field_0x8 + 0x3fe00000U & 0x3fe00000;
    *(uint *)&pLVar3->field_0x8 = uVar2 & 0xc01fffff | uVar5;
    uVar10 = uVar2 >> 7 & 0x1f;
    if ((uVar2 >> 0xc & 0xf) < uVar10) {
      uVar1 = *(uint *)&p->field_0x8;
      uVar9 = uVar1 >> 7 & 0x1f;
      if ((uVar1 >> 0xc & 0xf) < uVar9) {
        if (uVar9 < uVar10) {
          *(uint *)&pLVar3->field_0x8 =
               uVar2 & 0xc000ffff | uVar5 | (uVar1 & 0x10000) + (uVar1 >> 1 & 0xf0000);
          uVar5 = *(uint *)&p->field_0x8;
          uVar2 = (((int)(uVar5 << 0xf) >> 0x1f) + (uVar5 >> 0x11 & 0xf) & 0x1f) << 0x10;
        }
        else {
          *(uint *)&pLVar3->field_0x8 =
               uVar2 & 0xc000ffff | uVar5 |
               (((int)(uVar1 << 0xf) >> 0x1f) + (uVar1 >> 0x11 & 0xf) & 0x1f) << 0x10;
          uVar5 = *(uint *)&p->field_0x8;
          uVar2 = (uVar5 & 0x10000) + (uVar5 >> 1 & 0xf0000);
        }
        uVar2 = uVar5 & 0xffe0ffff | uVar2;
      }
      else {
        *(uint *)&pLVar3->field_0x8 = uVar2 & 0xc000ffff | uVar5 | uVar1 + 0x1f0000 & 0x1f0000;
        uVar2 = *(uint *)&p->field_0x8 & 0xffe0ffff | 0x10000;
      }
    }
    else {
      *(uint *)&pLVar3->field_0x8 = uVar2 & 0xc000ffff | uVar5 | 0x10000;
      uVar2 = *(uint *)&p->field_0x8 & 0xffe0ffff | *(uint *)&p->field_0x8 + 0x1f0000 & 0x1f0000;
    }
    *(uint *)&p->field_0x8 = uVar2;
    pLVar3->field_0xb = pLVar3->field_0xb | 0x80;
    return pLVar3;
  }
  __assert_fail("p->uSupp == Kit_TruthSupport(pTruth, p->nVars)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/lpk/lpkAbcMux.c"
                ,199,"Lpk_Fun_t *Lpk_MuxSplit(Lpk_Man_t *, Lpk_Fun_t *, int, int)");
}

Assistant:

Lpk_Fun_t * Lpk_MuxSplit( Lpk_Man_t * pMan, Lpk_Fun_t * p, int Var, int Pol )
{
    Lpk_Fun_t * pNew;
    unsigned * pTruth  = Lpk_FunTruth( p, 0 );
    unsigned * pTruth0 = Lpk_FunTruth( p, 1 );
    unsigned * pTruth1 = Lpk_FunTruth( p, 2 );
//    unsigned uSupp;
    int iVarVac; 
    assert( Var >= 0 && Var < (int)p->nVars );
    assert( p->nAreaLim >= 2 );
    assert( p->uSupp == Kit_BitMask(p->nVars) );
    Kit_TruthCofactor0New( pTruth0, pTruth, p->nVars, Var );
    Kit_TruthCofactor1New( pTruth1, pTruth, p->nVars, Var );
/*
uSupp = Kit_TruthSupport( pTruth, p->nVars );
Extra_PrintBinary( stdout, &uSupp, 16 ); printf( "\n" );
uSupp = Kit_TruthSupport( pTruth0, p->nVars );
Extra_PrintBinary( stdout, &uSupp, 16 ); printf( "\n" );
uSupp = Kit_TruthSupport( pTruth1, p->nVars );
Extra_PrintBinary( stdout, &uSupp, 16 ); printf( "\n\n" );
*/
    // derive the new component
    pNew = Lpk_FunDup( p, Pol ? pTruth0 : pTruth1 );
    // update the support of the old component
    p->uSupp  = Kit_TruthSupport( Pol ? pTruth1 : pTruth0, p->nVars );
    p->uSupp |= (1 << Var);
    // update the truth table of the old component
    iVarVac = Kit_WordFindFirstBit( ~p->uSupp );
    assert( iVarVac < (int)p->nVars );
    p->uSupp |= (1 << iVarVac);
    Kit_TruthIthVar( pTruth, p->nVars, iVarVac );
    if ( Pol )
        Kit_TruthMuxVar( pTruth, pTruth, pTruth1, p->nVars, Var );
    else
        Kit_TruthMuxVar( pTruth, pTruth0, pTruth, p->nVars, Var );
    assert( p->uSupp == Kit_TruthSupport(pTruth, p->nVars) );
    // set the decomposed variable
    p->pFanins[iVarVac] = pNew->Id;
    p->pDelays[iVarVac] = p->nDelayLim - 1;
    // support minimize both
    p->fSupports = 0;
    Lpk_FunSuppMinimize( p );
    Lpk_FunSuppMinimize( pNew );
    // update delay and area requirements
    pNew->nDelayLim = p->nDelayLim - 1;
    if ( pNew->nVars <= pNew->nLutK )
    {
        pNew->nAreaLim = 1;
        p->nAreaLim = p->nAreaLim - 1;
    }
    else if ( p->nVars <= p->nLutK )
    {
        pNew->nAreaLim = p->nAreaLim - 1;
        p->nAreaLim = 1;
    }
    else if ( p->nVars < pNew->nVars )
    {
        pNew->nAreaLim = p->nAreaLim / 2 + p->nAreaLim % 2;
        p->nAreaLim = p->nAreaLim / 2 - p->nAreaLim % 2;
    }
    else // if ( pNew->nVars < p->nVars )
    {
        pNew->nAreaLim = p->nAreaLim / 2 - p->nAreaLim % 2;
        p->nAreaLim = p->nAreaLim / 2 + p->nAreaLim % 2;
    }
    pNew->fMark = 1;
    return pNew;
}